

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

ImageT<unsigned_int,_4U> * __thiscall
ImageT<unsigned_int,4u>::copyTo<ImageT<unsigned_int,3u>>
          (ImageT<unsigned_int,4u> *this,ImageT<unsigned_int,_3U> *dst,string_view swizzle)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong local_48;
  long local_40;
  
  iVar2 = (**(code **)(*(long *)this + 0x30))(this,dst,swizzle._M_len);
  iVar3 = (**(code **)(*(long *)dst + 0x30))(dst);
  if (iVar2 != iVar3) {
    __assert_fail("getComponentSize() == dst.getComponentSize()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50a,
                  "ImageT<componentType, componentCount> &ImageT<unsigned int, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned int, componentCount = 4, DstImage = ImageT<unsigned int, 3>]"
                 );
  }
  iVar2 = *(int *)(this + 8);
  if ((iVar2 != *(int *)(dst + 8)) || (iVar3 = *(int *)(this + 0xc), iVar3 != *(int *)(dst + 0xc)))
  {
    __assert_fail("width == dst.getWidth() && height == dst.getHeight()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50b,
                  "ImageT<componentType, componentCount> &ImageT<unsigned int, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned int, componentCount = 4, DstImage = ImageT<unsigned int, 3>]"
                 );
  }
  *(undefined8 *)(dst + 0x10) = *(undefined8 *)(this + 0x10);
  if (iVar3 * iVar2 != 0) {
    local_40 = 0;
    local_48 = 0;
    do {
      iVar2 = (**(code **)(*(long *)dst + 0x28))(dst);
      uVar6 = 0;
      if (iVar2 != 0) {
        uVar6 = 0;
        do {
          uVar4 = (**(code **)(*(long *)this + 0x28))(this);
          if (uVar4 <= uVar6) break;
          lVar1 = *(long *)(dst + 0x18);
          uVar4 = ImageT<unsigned_int,_4U>::swizzlePixel
                            ((ImageT<unsigned_int,_4U> *)this,
                             (Color *)(*(long *)(this + 0x18) + local_48 * 0x10),
                             swizzle._M_str[uVar6]);
          uVar5 = 2;
          if ((uint)uVar6 < 2) {
            uVar5 = uVar6 & 0xffffffff;
          }
          *(uint *)(lVar1 + local_48 * 0xc + uVar5 * 4) = uVar4;
          uVar6 = uVar6 + 1;
          uVar4 = (**(code **)(*(long *)dst + 0x28))(dst);
        } while (uVar6 < uVar4);
      }
      uVar4 = (**(code **)(*(long *)dst + 0x28))(dst);
      if ((uint)uVar6 < uVar4) {
        uVar6 = uVar6 & 0xffffffff;
        do {
          if (uVar6 < 3) {
            *(undefined4 *)(*(long *)(dst + 0x18) + local_40 + uVar6 * 4) = 0;
          }
          else {
            *(undefined4 *)(*(long *)(dst + 0x18) + 8 + local_48 * 0xc) = 0xffffffff;
          }
          uVar6 = uVar6 + 1;
          uVar4 = (**(code **)(*(long *)dst + 0x28))(dst);
        } while (uVar6 < uVar4);
      }
      local_48 = local_48 + 1;
      local_40 = local_40 + 0xc;
    } while (local_48 < (uint)(*(int *)(this + 0xc) * *(int *)(this + 8)));
  }
  return (ImageT<unsigned_int,_4U> *)this;
}

Assistant:

ImageT& copyTo(DstImage& dst, std::string_view swizzle) {
        assert(getComponentSize() == dst.getComponentSize());
        assert(width == dst.getWidth() && height == dst.getHeight());

        dst.setTransferFunction(transferFunction);
        dst.setPrimaries(primaries);
        for (size_t i = 0; i < getPixelCount(); i++) {
            uint32_t c;
            for (c = 0; c < dst.getComponentCount(); c++) {
                if (c < getComponentCount())
                    dst.pixels[i].set(c, swizzlePixel(pixels[i], swizzle[c]));
                else
                    break;
            }
            for (; c < dst.getComponentCount(); c++)
                if (c < 3)
                    dst.pixels[i].set(c, componentType{0});
                else
                    dst.pixels[i].set(c, Color::one());
        }
        return *this;
    }